

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

size_t __thiscall
merlin::config_index::convert
          (config_index *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *config)

{
  pointer pvVar1;
  pointer pvVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_38,
             (long)(this->m_vars).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_vars).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  pvVar1 = (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pvVar2 - (long)pvVar1 >> 4;
  if (pvVar2 != pvVar1) {
    p_Var3 = (config->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var15 = &(config->_M_t)._M_impl.super__Rb_tree_header;
    lVar12 = 0;
    do {
      uVar4 = pvVar1[lVar12].m_label;
      p_Var14 = p_Var3;
      p_Var13 = &p_Var15->_M_header;
      for (; p_Var14 != (_Base_ptr)0x0;
          p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar4]) {
        if (*(ulong *)(p_Var14 + 1) >= uVar4) {
          p_Var13 = p_Var14;
        }
      }
      p_Var14 = &p_Var15->_M_header;
      if (((_Rb_tree_header *)p_Var13 != p_Var15) &&
         (p_Var14 = p_Var13, uVar4 < *(ulong *)(p_Var13 + 1))) {
        p_Var14 = &p_Var15->_M_header;
      }
      if ((_Rb_tree_header *)p_Var14 != p_Var15) {
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] = (unsigned_long)p_Var14[1]._M_parent;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar8 + (ulong)(lVar8 == 0));
  }
  if ((long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar8) {
    __assert_fail("values.size() == m_vars.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/index.h"
                  ,0x255,"size_t merlin::config_index::convert(std::map<size_t, size_t> &)");
  }
  puVar5 = (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->m_bigendian == true) {
    lVar8 = (long)puVar5 - (long)puVar6;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 3;
      lVar12 = 1;
      lVar11 = 0;
      sVar10 = 0;
      do {
        sVar10 = sVar10 + local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar11] * lVar12;
        lVar12 = lVar12 * puVar6[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar11);
      goto LAB_0013e140;
    }
  }
  else {
    uVar9 = (int)((ulong)((long)puVar5 - (long)puVar6) >> 3) - 1;
    if (-1 < (int)uVar9) {
      lVar12 = 1;
      sVar10 = 0;
      lVar8 = (ulong)uVar9 + 1;
      do {
        sVar10 = sVar10 + local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8 + -1] * lVar12;
        lVar12 = lVar12 * puVar6[lVar8 + -1];
        lVar11 = lVar8 + -1;
        bVar7 = 0 < lVar8;
        lVar8 = lVar11;
      } while (lVar11 != 0 && bVar7);
      goto LAB_0013e140;
    }
  }
  sVar10 = 0;
LAB_0013e140:
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return sVar10;
}

Assistant:

size_t convert(std::map<size_t, size_t>& config) {
		// The source variables are a subset of the config vector

		std::vector<size_t> values;
		values.resize(m_vars.size());
		for (size_t i = 0; i < m_vars.size(); ++i) {
			size_t var = m_vars[i].label();
			std::map<size_t, size_t>::iterator mi = config.find(var);
			if (mi != config.end()) {
				size_t val = mi->second;
				values[i] = val;
			}
		}

		// Safety checks
		assert(values.size() == m_vars.size());

		size_t index = 0, offset = 1;
		if (m_bigendian) { // start from the first variable
			for (size_t i = 0; i < m_dims.size(); ++i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		} else {
			for (int i = m_dims.size()-1; i >= 0; --i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		}

		return index;
	}